

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.hpp
# Opt level: O0

void __thiscall antlr::RecognitionException::~RecognitionException(RecognitionException *this)

{
  RecognitionException *in_RDI;
  
  ~RecognitionException(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

virtual ~RecognitionException() throw()
		{
		}